

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

void feat_compute_utt(feat_t *fcb,mfcc_t **mfc,int32 nfr,int32 win,mfcc_t ***feat)

{
  long lVar1;
  mfcc_t **ppmVar2;
  
  if (win < nfr - win) {
    ppmVar2 = mfc + win;
    lVar1 = 0;
    do {
      (*fcb->compute_feat)(fcb,ppmVar2,feat[lVar1]);
      lVar1 = lVar1 + 1;
      ppmVar2 = ppmVar2 + 1;
    } while (nfr + win * -2 != (int)lVar1);
  }
  if (fcb->lda != (mfcc_t ***)0x0) {
    feat_lda_transform(fcb,feat,nfr + win * -2);
  }
  if (fcb->subvecs != (int32 **)0x0) {
    feat_subvec_project(fcb,feat,nfr + win * -2);
    return;
  }
  return;
}

Assistant:

static void
feat_compute_utt(feat_t *fcb, mfcc_t **mfc, int32 nfr, int32 win, mfcc_t ***feat)
{
    int32 i;

    cep_dump_dbg(fcb, mfc, nfr, "Incoming features (after padding)");

    /* Create feature vectors */
    for (i = win; i < nfr - win; i++) {
        fcb->compute_feat(fcb, mfc + i, feat[i - win]);
    }

    feat_print_dbg(fcb, feat, nfr - win * 2, "After dynamic feature computation");

    if (fcb->lda) {
        feat_lda_transform(fcb, feat, nfr - win * 2);
        feat_print_dbg(fcb, feat, nfr - win * 2, "After LDA");
    }

    if (fcb->subvecs) {
        feat_subvec_project(fcb, feat, nfr - win * 2);
        feat_print_dbg(fcb, feat, nfr - win * 2, "After subvector projection");
    }
}